

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_json.cpp
# Opt level: O2

void __thiscall cppcms::rpc::json_rpc_server::json_rpc_server(json_rpc_server *this,service *srv)

{
  _Rb_tree_header *p_Var1;
  
  application::application(&this->super_application,srv);
  (this->super_application)._vptr_application = (_func_int **)&PTR__json_rpc_server_002b7a88;
  (this->methods_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->methods_)._M_t._M_impl.super__Rb_tree_header;
  (this->methods_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->methods_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->methods_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->methods_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->current_call_).super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->current_call_).super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->smd_)._M_dataplus._M_p = (pointer)&(this->smd_).field_2;
  (this->smd_)._M_string_length = 0;
  (this->smd_).field_2._M_local_buf[0] = '\0';
  (this->d).ptr_ = (_data *)0x0;
  return;
}

Assistant:

json_rpc_server::json_rpc_server(cppcms::service &srv) :
		application(srv)
	{	
	}